

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

char * dec_ctx_init(dec_ctx *ctx,membuf *inbuf,membuf *outbuf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  ctx->bits_read = 0;
  ctx->inbuf = (uchar *)inbuf->buf;
  ctx->inend = inbuf->len;
  ctx->inpos = 0;
  ctx->outbuf = outbuf;
  uVar1 = get_byte(ctx);
  ctx->bitbuf = uVar1;
  ctx->t[0].table_bit[0] = '\x02';
  ctx->t[0].table_bit[1] = '\x04';
  ctx->t[0].table_bit[2] = '\x04';
  ctx->t[0].table_off[0] = '0';
  ctx->t[0].table_off[1] = ' ';
  ctx->t[0].table_off[2] = '\x10';
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar3 = (1 << ((byte)iVar2 & 0x1f)) + iVar3;
    if ((uVar4 & 0xf) == 0) {
      iVar3 = 1;
    }
    ctx->t[0].table_lo[uVar4] = (uchar)iVar3;
    ctx->t[0].table_hi[uVar4] = (uchar)((uint)iVar3 >> 8);
    iVar2 = get_bits(ctx,4);
    ctx->t[0].table_bi[uVar4] = (uchar)iVar2;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x34);
  table_dump(ctx->t);
  return table_dump::buf;
}

Assistant:

char *
dec_ctx_init(struct dec_ctx *ctx, struct membuf *inbuf, struct membuf *outbuf)
{
    char *encoding;
    ctx->bits_read = 0;

    ctx->inbuf = membuf_get(inbuf);
    ctx->inend = membuf_memlen(inbuf);
    ctx->inpos = 0;

    ctx->outbuf = outbuf;

    /* init bitbuf */
    ctx->bitbuf = get_byte(ctx);

    /* init tables */
    table_init(ctx, ctx->t);
    encoding = table_dump(ctx->t);
    return encoding;
}